

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

char * ma_find_char(char *str,char c,int *index)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (str[lVar2] == '\0') {
      pcVar1 = (char *)0x0;
      if (index != (int *)0x0) {
        lVar2 = -1;
LAB_0010699b:
        *index = (int)lVar2;
      }
      return pcVar1;
    }
    if (str[lVar2] == c) {
      pcVar1 = str + lVar2;
      if (index == (int *)0x0) {
        return pcVar1;
      }
      goto LAB_0010699b;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static const char* ma_find_char(const char* str, char c, int* index)
{
    int i = 0;
    for (;;) {
        if (str[i] == '\0') {
            if (index) *index = -1;
            return NULL;
        }

        if (str[i] == c) {
            if (index) *index = i;
            return str + i;
        }

        i += 1;
    }

    /* Should never get here, but treat it as though the character was not found to make me feel better inside. */
    if (index) *index = -1;
    return NULL;
}